

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O1

void __thiscall nuraft::snapshot_io_mgr::snapshot_io_mgr(snapshot_io_mgr *this)

{
  EventAwaiter *__p;
  thread local_40;
  snapshot_io_mgr *local_38;
  code *local_30;
  undefined8 local_28;
  
  (this->io_thread_)._M_id._M_thread = 0;
  __p = (EventAwaiter *)operator_new(0x60);
  (__p->status)._M_i = idle;
  (__p->cvLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(__p->cvLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(__p->cvLock).super___mutex_base._M_mutex + 0x10) = 0;
  (__p->cvLock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (__p->cvLock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&__p->cv);
  (this->io_thread_ea_).super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<nuraft::EventAwaiter*>
            (&(this->io_thread_ea_).
              super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p);
  (this->terminating_)._M_base._M_i = false;
  (this->queue_).
  super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->queue_;
  (this->queue_).
  super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->queue_;
  (this->queue_).
  super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->queue_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->queue_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->queue_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->queue_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->queue_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_30 = async_io_loop;
  local_28 = 0;
  local_38 = this;
  std::thread::thread<void(nuraft::snapshot_io_mgr::*)(),nuraft::snapshot_io_mgr*,void>
            (&local_40,(offset_in_snapshot_io_mgr_to_subr *)&local_30,&local_38);
  if ((this->io_thread_)._M_id._M_thread == 0) {
    (this->io_thread_)._M_id._M_thread = (native_handle_type)local_40._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

snapshot_io_mgr::snapshot_io_mgr()
    : io_thread_ea_(new EventAwaiter())
    , terminating_(false)
{
    io_thread_ = std::thread(&snapshot_io_mgr::async_io_loop, this);
}